

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

size_t Imf_3_3::bytesPerDeepLineTable
                 (Header *header,char *base,int xStride,int yStride,
                 vector<unsigned_long,_std::allocator<unsigned_long>_> *bytesPerLine)

{
  size_t sVar1;
  int in_stack_00000058;
  int in_stack_0000005c;
  char *in_stack_00000060;
  int in_stack_00000068;
  int in_stack_0000006c;
  Header *in_stack_00000070;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000080;
  
  Header::dataWindow((Header *)0x97aaaf);
  Header::dataWindow((Header *)0x97aac0);
  sVar1 = bytesPerDeepLineTable
                    (in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000060,
                     in_stack_0000005c,in_stack_00000058,in_stack_00000080);
  return sVar1;
}

Assistant:

size_t
bytesPerDeepLineTable (
    const Header&   header,
    char*           base,
    int             xStride,
    int             yStride,
    vector<size_t>& bytesPerLine)
{
    return bytesPerDeepLineTable (
        header,
        header.dataWindow ().min.y,
        header.dataWindow ().max.y,
        base,
        xStride,
        yStride,
        bytesPerLine);
}